

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringPool.hpp
# Opt level: O2

size_t __thiscall Diligent::StringPool::GetRemainingSize(StringPool *this)

{
  size_t sVar1;
  Char *pCVar2;
  Char *pCVar3;
  string msg;
  string local_30;
  
  pCVar2 = this->m_pBuffer;
  pCVar3 = this->m_pCurrPtr;
  sVar1 = this->m_ReservedSize;
  if (pCVar2 + sVar1 < pCVar3) {
    FormatString<char[16]>(&local_30,(char (*) [16])"Buffer overflow");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetRemainingSize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/StringPool.hpp"
               ,0x9c);
    std::__cxx11::string::~string((string *)&local_30);
    sVar1 = this->m_ReservedSize;
    pCVar2 = this->m_pBuffer;
    pCVar3 = this->m_pCurrPtr;
  }
  return (size_t)(pCVar2 + (sVar1 - (long)pCVar3));
}

Assistant:

size_t GetRemainingSize() const
    {
        VERIFY(m_pCurrPtr <= m_pBuffer + m_ReservedSize, "Buffer overflow");
        return m_ReservedSize - (m_pCurrPtr - m_pBuffer);
    }